

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.cpp
# Opt level: O2

ostream * wasm::operator<<(ostream *o,WasmException *exn)

{
  ostream *poVar1;
  char *in_RCX;
  Name name;
  SmallVector<wasm::Literal,_1UL> local_60;
  undefined1 local_28 [8];
  shared_ptr<wasm::ExnData> exnData;
  
  Literal::getExnData((Literal *)local_28);
  name.super_IString.str._M_str = in_RCX;
  name.super_IString.str._M_len =
       (((Literals *)((long)local_28 + 8))->super_SmallVector<wasm::Literal,_1UL>).usedFixed;
  poVar1 = operator<<((wasm *)o,(ostream *)((HeapType *)local_28)->id,name);
  poVar1 = std::operator<<(poVar1," ");
  SmallVector<wasm::Literal,_1UL>::SmallVector
            (&local_60,
             (SmallVector<wasm::Literal,_1UL> *)
             &(((Literals *)((long)local_28 + 8))->super_SmallVector<wasm::Literal,_1UL>).fixed);
  poVar1 = operator<<(poVar1,(Literals *)&local_60);
  SmallVector<wasm::Literal,_1UL>::~SmallVector(&local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&exnData);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& o, const WasmException& exn) {
  auto exnData = exn.exn.getExnData();
  return o << exnData->tag << " " << exnData->payload;
}